

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_timeout(Curl_multi *multi,curltime *expire_time,long *timeout_ms)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [12];
  undefined4 uVar6;
  Curl_tree *pCVar7;
  timediff_t tVar8;
  curltime cVar9;
  curltime newer;
  curltime newer_00;
  curltime older;
  timediff_t diff;
  curltime now;
  long *timeout_ms_local;
  curltime *expire_time_local;
  Curl_multi *multi_local;
  
  if (((byte)multi->field_0x279 >> 4 & 1) == 0) {
    if (multi->timetree == (Curl_tree *)0x0) {
      expire_time->tv_sec = 0;
      expire_time->tv_usec = 0;
      *(undefined4 *)&expire_time->field_0xc = 0;
      *timeout_ms = -1;
    }
    else {
      cVar9 = Curl_now();
      pCVar7 = Curl_splay((curltime)ZEXT816((ulong)0),multi->timetree);
      multi->timetree = pCVar7;
      if (multi->timetree == (Curl_tree *)0x0) {
        expire_time->tv_sec = 0;
        expire_time->tv_usec = 0;
        *(undefined4 *)&expire_time->field_0xc = 0;
      }
      else {
        pCVar7 = multi->timetree;
        expire_time->tv_sec = (pCVar7->key).tv_sec;
        uVar6 = *(undefined4 *)&(pCVar7->key).field_0xc;
        expire_time->tv_usec = (pCVar7->key).tv_usec;
        *(undefined4 *)&expire_time->field_0xc = uVar6;
      }
      if (multi->timetree != (Curl_tree *)0x0) {
        uVar1 = (multi->timetree->key).tv_sec;
        uVar2 = (multi->timetree->key).tv_usec;
        newer.tv_usec = uVar2;
        newer.tv_sec = uVar1;
        auVar5 = cVar9._0_12_;
        newer._12_4_ = 0;
        cVar9._12_4_ = 0;
        cVar9.tv_sec = auVar5._0_8_;
        cVar9.tv_usec = auVar5._8_4_;
        tVar8 = Curl_timediff_us(newer,cVar9);
        if (0 < tVar8) {
          uVar3 = (multi->timetree->key).tv_sec;
          uVar4 = (multi->timetree->key).tv_usec;
          newer_00.tv_usec = uVar4;
          newer_00.tv_sec = uVar3;
          newer_00._12_4_ = 0;
          older._12_4_ = 0;
          older.tv_sec = auVar5._0_8_;
          older.tv_usec = auVar5._8_4_;
          tVar8 = Curl_timediff_ceil(newer_00,older);
          *timeout_ms = tVar8;
          return CURLM_OK;
        }
      }
      *timeout_ms = 0;
    }
  }
  else {
    *timeout_ms = 0;
  }
  return CURLM_OK;
}

Assistant:

static CURLMcode multi_timeout(struct Curl_multi *multi,
                               struct curltime *expire_time,
                               long *timeout_ms)
{
  static const struct curltime tv_zero = {0, 0};

  if(multi->dead) {
    *timeout_ms = 0;
    return CURLM_OK;
  }

  if(multi->timetree) {
    /* we have a tree of expire times */
    struct curltime now = Curl_now();

    /* splay the lowest to the bottom */
    multi->timetree = Curl_splay(tv_zero, multi->timetree);
    /* this will not return NULL from a non-emtpy tree, but some compilers
     * are not convinced of that. Analyzers are hard. */
    *expire_time = multi->timetree ? multi->timetree->key : tv_zero;

    /* 'multi->timetree' will be non-NULL here but the compilers sometimes
       yell at us if we assume so */
    if(multi->timetree &&
       Curl_timediff_us(multi->timetree->key, now) > 0) {
      /* some time left before expiration */
      timediff_t diff = Curl_timediff_ceil(multi->timetree->key, now);
      /* this should be safe even on 32-bit archs, as we do not use that
         overly long timeouts */
      *timeout_ms = (long)diff;
    }
    else {
      /* 0 means immediately */
      *timeout_ms = 0;
    }
  }
  else {
    *expire_time = tv_zero;
    *timeout_ms = -1;
  }

  return CURLM_OK;
}